

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

boolean encode_mcu_huff(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  undefined4 uVar2;
  jpeg_destination_mgr *pjVar3;
  undefined8 uVar4;
  j_compress_ptr pjVar5;
  boolean bVar6;
  JOCTET *pJVar7;
  jpeg_entropy_encoder *pjVar8;
  JOCTET *__n;
  JOCTET *__src;
  long lVar9;
  working_state state;
  undefined1 local_290 [28];
  int iStack_274;
  _func_void_j_compress_ptr *local_270;
  _func_void_j_compress_ptr_boolean *p_Stack_268;
  j_compress_ptr local_260;
  int local_258;
  jpeg_entropy_encoder *local_250;
  JBLOCKROW *local_248;
  j_compress_ptr local_240;
  JOCTET local_238 [520];
  
  pjVar8 = cinfo->entropy;
  local_290._0_8_ = cinfo->dest->next_output_byte;
  local_290._8_8_ = cinfo->dest->free_in_buffer;
  local_290._16_8_ = *(anon_union_8_2_c960f3a9_for_put_buffer *)(pjVar8 + 1);
  unique0x100001d7 = pjVar8[1].encode_mcu;
  local_270 = pjVar8[1].finish_pass;
  p_Stack_268 = pjVar8[2].start_pass;
  local_260 = cinfo;
  local_258 = *(int *)&pjVar8[8].start_pass;
  local_250 = pjVar8;
  if ((cinfo->restart_interval != 0) && (*(int *)&pjVar8[2].encode_mcu == 0)) {
    uVar2 = *(undefined4 *)((long)&pjVar8[2].encode_mcu + 4);
    bVar6 = flush_bits((working_state *)local_290);
    if (bVar6 == 0) {
      return 0;
    }
    pJVar7 = (JOCTET *)(local_290._0_8_ + 1);
    *(JOCTET *)local_290._0_8_ = 0xff;
    local_290._8_8_ = local_290._8_8_ + -1;
    local_290._0_8_ = pJVar7;
    if ((JOCTET *)local_290._8_8_ == (JOCTET *)0x0) {
      pjVar3 = local_260->dest;
      bVar6 = (*pjVar3->empty_output_buffer)(local_260);
      if (bVar6 == 0) {
        return 0;
      }
      local_290._0_8_ = pjVar3->next_output_byte;
      local_290._8_8_ = pjVar3->free_in_buffer;
    }
    pjVar8 = local_250;
    pJVar7 = (JOCTET *)(local_290._0_8_ + 1);
    *(JOCTET *)local_290._0_8_ = (char)uVar2 + 0xd0;
    local_290._8_8_ = local_290._8_8_ + -1;
    local_290._0_8_ = pJVar7;
    if ((JOCTET *)local_290._8_8_ == (JOCTET *)0x0) {
      pjVar3 = local_260->dest;
      bVar6 = (*pjVar3->empty_output_buffer)(local_260);
      if (bVar6 == 0) {
        return 0;
      }
      local_290._0_8_ = pjVar3->next_output_byte;
      local_290._8_8_ = pjVar3->free_in_buffer;
    }
    pjVar5 = local_260;
    if (0 < local_260->comps_in_scan) {
      lVar9 = 0;
      do {
        (&iStack_274)[lVar9] = 0;
        lVar9 = lVar9 + 1;
      } while (lVar9 < pjVar5->comps_in_scan);
    }
  }
  if (*(int *)&pjVar8[8].start_pass == 0) {
    if (0 < cinfo->blocks_in_MCU) {
      lVar9 = 0;
      do {
        iVar1 = cinfo->MCU_membership[lVar9];
        bVar6 = encode_one_block((working_state *)local_290,*MCU_data[lVar9],(&iStack_274)[iVar1],
                                 (c_derived_tbl *)
                                 (&pjVar8[2].finish_pass)[cinfo->cur_comp_info[iVar1]->dc_tbl_no],
                                 (c_derived_tbl *)
                                 (&pjVar8[4].start_pass)[cinfo->cur_comp_info[iVar1]->ac_tbl_no]);
        if (bVar6 == 0) {
          return 0;
        }
        (&iStack_274)[iVar1] = (int)(*MCU_data[lVar9])[0];
        lVar9 = lVar9 + 1;
      } while (lVar9 < cinfo->blocks_in_MCU);
    }
  }
  else if (0 < cinfo->blocks_in_MCU) {
    lVar9 = 0;
    local_240 = cinfo;
    local_248 = MCU_data;
    do {
      uVar4 = local_290._8_8_;
      pJVar7 = local_238;
      if ((JOCTET *)0x1ff < (ulong)local_290._8_8_) {
        pJVar7 = (JOCTET *)local_290._0_8_;
      }
      iVar1 = local_240->MCU_membership[lVar9];
      pJVar7 = jsimd_huff_encode_one_block
                         (local_290,pJVar7,*MCU_data[lVar9],(&iStack_274)[iVar1],
                          (c_derived_tbl *)
                          (&pjVar8[2].finish_pass)[local_240->cur_comp_info[iVar1]->dc_tbl_no],
                          (c_derived_tbl *)
                          (&pjVar8[4].start_pass)[local_240->cur_comp_info[iVar1]->ac_tbl_no]);
      if ((ulong)uVar4 < (JOCTET *)0x200) {
        pJVar7 = pJVar7 + -(long)local_238;
        if (pJVar7 != (JOCTET *)0x0) {
          __src = local_238;
          do {
            __n = (JOCTET *)local_290._8_8_;
            if (pJVar7 < (ulong)local_290._8_8_) {
              __n = pJVar7;
            }
            memcpy((void *)local_290._0_8_,__src,(size_t)__n);
            local_290._0_8_ = local_290._0_8_ + (long)__n;
            local_290._8_8_ = local_290._8_8_ + -(long)__n;
            if ((JOCTET *)local_290._8_8_ == (JOCTET *)0x0) {
              pjVar3 = local_260->dest;
              bVar6 = (*pjVar3->empty_output_buffer)(local_260);
              if (bVar6 == 0) {
                return 0;
              }
              local_290._0_8_ = pjVar3->next_output_byte;
              local_290._8_8_ = pjVar3->free_in_buffer;
            }
            __src = __src + (long)__n;
            pJVar7 = pJVar7 + -(long)__n;
          } while (pJVar7 != (JOCTET *)0x0);
        }
      }
      else {
        local_290._8_8_ = local_290._0_8_ + (local_290._8_8_ - (long)pJVar7);
        local_290._0_8_ = pJVar7;
      }
      MCU_data = local_248;
      (&iStack_274)[iVar1] = (int)(*local_248[lVar9])[0];
      lVar9 = lVar9 + 1;
      pjVar8 = local_250;
      cinfo = local_240;
    } while (lVar9 < local_240->blocks_in_MCU);
  }
  pjVar3 = cinfo->dest;
  pjVar3->next_output_byte = (JOCTET *)local_290._0_8_;
  pjVar3->free_in_buffer = local_290._8_8_;
  pjVar8[1].finish_pass = local_270;
  pjVar8[2].start_pass = p_Stack_268;
  *(undefined8 *)(pjVar8 + 1) = local_290._16_8_;
  pjVar8[1].encode_mcu = stack0xfffffffffffffd88;
  if (cinfo->restart_interval != 0) {
    if (*(int *)&pjVar8[2].encode_mcu == 0) {
      *(uint *)&pjVar8[2].encode_mcu = cinfo->restart_interval;
      *(uint *)((long)&pjVar8[2].encode_mcu + 4) =
           *(int *)((long)&pjVar8[2].encode_mcu + 4) + 1U & 7;
    }
    *(int *)&pjVar8[2].encode_mcu = *(int *)&pjVar8[2].encode_mcu + -1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_huff(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  working_state state;
  int blkn, ci;
  jpeg_component_info *compptr;

  /* Load up working state */
  state.next_output_byte = cinfo->dest->next_output_byte;
  state.free_in_buffer = cinfo->dest->free_in_buffer;
  state.cur = entropy->saved;
  state.cinfo = cinfo;
  state.simd = entropy->simd;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!emit_restart(&state, entropy->next_restart_num))
        return FALSE;
  }

  /* Encode the MCU data blocks */
  if (entropy->simd) {
    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      if (!encode_one_block_simd(&state,
                                 MCU_data[blkn][0], state.cur.last_dc_val[ci],
                                 entropy->dc_derived_tbls[compptr->dc_tbl_no],
                                 entropy->ac_derived_tbls[compptr->ac_tbl_no]))
        return FALSE;
      /* Update last_dc_val */
      state.cur.last_dc_val[ci] = MCU_data[blkn][0][0];
    }
  } else {
    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      if (!encode_one_block(&state,
                            MCU_data[blkn][0], state.cur.last_dc_val[ci],
                            entropy->dc_derived_tbls[compptr->dc_tbl_no],
                            entropy->ac_derived_tbls[compptr->ac_tbl_no]))
        return FALSE;
      /* Update last_dc_val */
      state.cur.last_dc_val[ci] = MCU_data[blkn][0][0];
    }
  }

  /* Completed MCU, so update state */
  cinfo->dest->next_output_byte = state.next_output_byte;
  cinfo->dest->free_in_buffer = state.free_in_buffer;
  entropy->saved = state.cur;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}